

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O1

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::SignalLink::~SignalLink
          (SignalLink *this)

{
  _Manager_type p_Var1;
  
  if (this->ref_count == 0) {
    p_Var1 = (this->function).super__Function_base._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)((_Any_data *)&this->function,(_Any_data *)&this->function,__destroy_functor);
    }
    return;
  }
  __assert_fail("ref_count == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                ,0x50,
                "Simple::Lib::ProtoSignal<bool (), Simple::CollectorWhile0<bool>>::SignalLink::~SignalLink()"
               );
}

Assistant:

void        incref     () { ref_count += 1; assert (ref_count > 0); }